

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSymmetry.c
# Opt level: O1

int ddSymmGroupMove(DdManager *table,int x,int y,Move **moves)

{
  uint uVar1;
  DdSubtable *pDVar2;
  int iVar3;
  DdHalfWord DVar4;
  uint uVar5;
  DdNode *pDVar6;
  int iVar7;
  uint *puVar8;
  uint uVar9;
  uint uVar10;
  DdHalfWord x_00;
  int iVar11;
  int iVar12;
  DdHalfWord DVar13;
  int iVar14;
  DdHalfWord y_00;
  bool bVar15;
  
  uVar1 = table->subtables[x].next;
  uVar5 = y;
  do {
    uVar10 = uVar5;
    uVar5 = table->subtables[(int)uVar10].next;
  } while (uVar10 < uVar5);
  iVar11 = x - uVar1;
  iVar12 = uVar10 - y;
  if (iVar12 < 0) {
    iVar3 = -1;
    x_00 = 0xffffffff;
    y_00 = 0xffffffff;
  }
  else {
    y_00 = 0xffffffff;
    x_00 = 0xffffffff;
    iVar3 = -1;
    DVar4 = x;
    DVar13 = y;
    iVar7 = 1;
    do {
      iVar14 = iVar11 + 1;
      if (-1 < iVar11) {
        do {
          y_00 = DVar13;
          x_00 = DVar4;
          iVar3 = cuddSwapInPlace(table,x_00,y_00);
          if (iVar3 == 0) goto LAB_007e5f65;
          iVar14 = iVar14 + -1;
          DVar4 = x_00 - 1;
          DVar13 = x_00;
        } while (iVar14 != 0);
      }
      DVar13 = iVar7 + y;
      DVar4 = (iVar7 + y) - 1;
      bVar15 = iVar7 != (uVar10 - y) + 1;
      iVar7 = iVar7 + 1;
    } while (bVar15);
  }
  uVar5 = uVar1;
  if (0 < iVar12) {
    puVar8 = &table->subtables[(int)uVar1].next;
    do {
      uVar5 = uVar5 + 1;
      *puVar8 = uVar5;
      puVar8 = puVar8 + 0xe;
      iVar12 = iVar12 + -1;
    } while (iVar12 != 0);
  }
  pDVar2 = table->subtables;
  pDVar2[(int)uVar5].next = uVar1;
  uVar9 = uVar5 + 1;
  uVar10 = uVar9;
  if (0 < iVar11) {
    puVar8 = &pDVar2[(int)uVar9].next;
    uVar5 = uVar5 + 2;
    iVar11 = 0;
    do {
      *puVar8 = uVar5;
      puVar8 = puVar8 + 0xe;
      iVar11 = iVar11 + -1;
      uVar5 = uVar5 + 1;
    } while (uVar1 - x != iVar11);
    uVar10 = uVar9 - iVar11;
  }
  pDVar2[(int)uVar10].next = uVar9;
  pDVar6 = cuddDynamicAllocNode(table);
  if (pDVar6 == (DdNode *)0x0) {
LAB_007e5f65:
    iVar3 = 0;
  }
  else {
    pDVar6->index = x_00;
    pDVar6->ref = y_00;
    *(int *)((long)&pDVar6->next + 4) = iVar3;
    (pDVar6->type).kids.T = (DdNode *)*moves;
    *moves = (Move *)pDVar6;
  }
  return iVar3;
}

Assistant:

static int
ddSymmGroupMove(
  DdManager * table,
  int  x,
  int  y,
  Move ** moves)
{
    Move *move;
    int  size = -1;
    int  i,j;
    int  xtop,xbot,xsize,ytop,ybot,ysize,newxtop;
    int  swapx = -1,swapy = -1;

#ifdef DD_DEBUG
    assert(x < y);      /* we assume that x < y */
#endif
    /* Find top, bottom, and size for the two groups. */
    xbot = x;
    xtop = table->subtables[x].next;
    xsize = xbot - xtop + 1;
    ybot = y;
    while ((unsigned) ybot < table->subtables[ybot].next)
        ybot = table->subtables[ybot].next;
    ytop = y;
    ysize = ybot - ytop + 1;

    /* Sift the variables of the second group up through the first group. */
    for (i = 1; i <= ysize; i++) {
        for (j = 1; j <= xsize; j++) {
            size = cuddSwapInPlace(table,x,y);
            if (size == 0) return(0);
            swapx = x; swapy = y;
            y = x;
            x = y - 1;
        }
        y = ytop + i;
        x = y - 1;
    }

    /* fix symmetries */
    y = xtop; /* ytop is now where xtop used to be */
    for (i = 0; i < ysize-1 ; i++) {
        table->subtables[y].next = y + 1;
        y = y + 1;
    }
    table->subtables[y].next = xtop; /* y is bottom of its group, join */
                                     /* its symmetry to top of its group */
    x = y + 1;
    newxtop = x;
    for (i = 0; i < xsize - 1 ; i++) {
        table->subtables[x].next = x + 1;
        x = x + 1;
    }
    table->subtables[x].next = newxtop; /* x is bottom of its group, join */
                                        /* its symmetry to top of its group */
    /* Store group move */
    move = (Move *) cuddDynamicAllocNode(table);
    if (move == NULL) return(0);
    move->x = swapx;
    move->y = swapy;
    move->size = size;
    move->next = *moves;
    *moves = move;

    return(size);

}